

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entries.cpp
# Opt level: O0

Data * DL::Expressions::union_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *param_2)

{
  VM *this;
  bool bVar1;
  DataType DVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference this_00;
  DataGroup *pDVar5;
  vector_t<Data> *pvVar6;
  reference data_00;
  allocator local_119;
  string local_118 [39];
  undefined1 local_f1;
  reference local_f0;
  Data *data_1;
  const_iterator __end6_1;
  const_iterator __begin6_1;
  vector_t<Data> *__range6_1;
  Data *data;
  const_iterator __end6;
  const_iterator __begin6;
  vector_t<Data> *__range6;
  Data *d;
  const_iterator __end4;
  const_iterator __begin4;
  vector_t<Data> *__range4;
  string local_88 [32];
  undefined1 local_68 [8];
  DataGroup grp;
  allocator local_41;
  string local_40 [32];
  VM *local_20;
  VM *param_1_local;
  vector_t<Data> *args_local;
  Data *r;
  
  local_20 = param_2;
  param_1_local = (VM *)args;
  args_local = (vector_t<Data> *)__return_storage_ptr__;
  sVar3 = std::vector<DL::Data,_std::allocator<DL::Data>_>::size(args);
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    Data::Data(__return_storage_ptr__,(string_t *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    sVar3 = std::vector<DL::Data,_std::allocator<DL::Data>_>::size
                      ((vector<DL::Data,_std::allocator<DL::Data>_> *)param_1_local);
    if (sVar3 == 1) {
      pvVar4 = std::vector<DL::Data,_std::allocator<DL::Data>_>::front
                         ((vector<DL::Data,_std::allocator<DL::Data>_> *)param_1_local);
      Data::Data(__return_storage_ptr__,pvVar4);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"",(allocator *)((long)&__range4 + 7));
      DataGroup::DataGroup((DataGroup *)local_68,(string_t *)local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
      this = param_1_local;
      __end4 = std::vector<DL::Data,_std::allocator<DL::Data>_>::begin
                         ((vector<DL::Data,_std::allocator<DL::Data>_> *)param_1_local);
      d = (Data *)std::vector<DL::Data,_std::allocator<DL::Data>_>::end
                            ((vector<DL::Data,_std::allocator<DL::Data>_> *)this);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                                         *)&d), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                  ::operator*(&__end4);
        DVar2 = Data::type(this_00);
        if (DVar2 == DT_Group) {
          pDVar5 = Data::getGroup(this_00);
          pvVar6 = DataGroup::getNamedEntries(pDVar5);
          __end6 = std::vector<DL::Data,_std::allocator<DL::Data>_>::begin(pvVar6);
          data = (Data *)std::vector<DL::Data,_std::allocator<DL::Data>_>::end(pvVar6);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end6,(__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                                             *)&data), bVar1) {
            data_00 = __gnu_cxx::
                      __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                      ::operator*(&__end6);
            DataGroup::add((DataGroup *)local_68,data_00);
            __gnu_cxx::
            __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
            operator++(&__end6);
          }
          pDVar5 = Data::getGroup(this_00);
          pvVar6 = DataGroup::getAnonymousEntries(pDVar5);
          __end6_1 = std::vector<DL::Data,_std::allocator<DL::Data>_>::begin(pvVar6);
          data_1 = (Data *)std::vector<DL::Data,_std::allocator<DL::Data>_>::end(pvVar6);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end6_1,
                                    (__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                                     *)&data_1), bVar1) {
            local_f0 = __gnu_cxx::
                       __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                       ::operator*(&__end6_1);
            DataGroup::add((DataGroup *)local_68,local_f0);
            __gnu_cxx::
            __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
            operator++(&__end6_1);
          }
        }
        else {
          DataGroup::add((DataGroup *)local_68,this_00);
        }
        __gnu_cxx::
        __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
        operator++(&__end4);
      }
      local_f1 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"",&local_119);
      Data::Data(__return_storage_ptr__,(string_t *)local_118);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      Data::setGroup(__return_storage_ptr__,(DataGroup *)local_68);
      local_f1 = 1;
      DataGroup::~DataGroup((DataGroup *)local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data union_func(const vector_t<Data>& args, VM& /*vm*/)
{
	if (args.size() == 0) {
		return Data();
	} else if (args.size() == 1) {
		return args.front();
	} else {
		DataGroup grp;
		for (const Data& d : args) {
			if (d.type() == DT_Group) {
				for (const Data& data : d.getGroup().getNamedEntries())
					grp.add(data);

				for (const Data& data : d.getGroup().getAnonymousEntries())
					grp.add(data);
			} else {
				grp.add(d);
			}
		}

		Data r;
		r.setGroup(grp);
		return r;
	}
}